

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.h
# Opt level: O2

bool __thiscall Settings::load(Settings *this,char *file_name)

{
  double dVar1;
  bool bVar2;
  uint32_t output;
  int iVar3;
  DebugStream *pDVar4;
  uint64_t uVar5;
  uint uVar6;
  allocator local_b7b;
  allocator local_b7a;
  allocator local_b79;
  string local_b78;
  IniFile settingsFile;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0 [32];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60 [32];
  string local_40;
  
  settingsFile.m_values._M_h._M_buckets = &settingsFile.m_values._M_h._M_single_bucket;
  settingsFile.m_values._M_h._M_bucket_count = 1;
  settingsFile.m_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  settingsFile.m_values._M_h._M_element_count = 0;
  settingsFile.m_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  settingsFile.m_values._M_h._M_rehash_policy._M_next_resize = 0;
  settingsFile.m_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&local_40,file_name,(allocator *)&local_b78);
  bVar2 = utils::IniFile::readFile(&settingsFile,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cerr,"Unable to load settings, using defaults");
  }
  std::__cxx11::string::string(local_60,"settings",&local_b7b);
  debug(&local_b78);
  pDVar4 = DebugStream::operator<<((DebugStream *)&local_b78,"Loading settings file");
  DebugStream::operator<<(pDVar4,file_name);
  DebugStream::~DebugStream((DebugStream *)&local_b78);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string((string *)&local_80,"Load",&local_b7b);
  std::__cxx11::string::string((string *)&local_a0,"usr_operator_path",&local_b79);
  std::__cxx11::string::string
            ((string *)&local_c0,"../build/usr_operators/libusr_operators.so",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_80,&local_a0,&local_c0);
  std::__cxx11::string::operator=((string *)this,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_e0,"Load",&local_b7b);
  std::__cxx11::string::string((string *)&local_100,"usr_class_path",&local_b79);
  std::__cxx11::string::string((string *)&local_120,"./V1.2/user.classes.replicode",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_e0,&local_100,&local_120);
  std::__cxx11::string::operator=((string *)&this->usr_class_path,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_140,"Load",&local_b7b);
  std::__cxx11::string::string((string *)&local_160,"source_file_name",&local_b79);
  std::__cxx11::string::string((string *)&local_180,"./V1.2/test.2.replicode",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_140,&local_160,&local_180);
  std::__cxx11::string::operator=((string *)&this->source_file_name,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  output = std::thread::hardware_concurrency();
  std::__cxx11::string::string(local_1a0,"settings",&local_b7b);
  debug(&local_b78);
  pDVar4 = DebugStream::operator<<((DebugStream *)&local_b78,"number of CPU cores available:");
  DebugStream::operator<<(pDVar4,output);
  DebugStream::~DebugStream((DebugStream *)&local_b78);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::string((string *)&local_1c0,"Init",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_1e0,"base_period",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_1c0,&local_1e0,50000);
  this->base_period = uVar5;
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&local_200,"Init",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_220,"reduction_core_count",&local_b7b);
  uVar6 = output * 3 >> 2;
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_200,&local_220,(ulong)(uVar6 + 1));
  this->reduction_core_count = uVar5;
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_240,"Init",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_260,"time_core_count",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_240,&local_260,(ulong)((output - uVar6) + 1));
  this->time_core_count = uVar5;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string((string *)&local_280,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_2a0,"mdl_inertia_sr_thr",&local_b7b);
  dVar1 = utils::IniFile::getDouble(&settingsFile,&local_280,&local_2a0,0.9);
  this->mdl_inertia_sr_thr = dVar1;
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string((string *)&local_2c0,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_2e0,"mdl_inertia_cnt_thr",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_2c0,&local_2e0,6);
  this->mdl_inertia_cnt_thr = uVar5;
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::string((string *)&local_300,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_320,"tpx_dsr_thr",&local_b7b);
  dVar1 = utils::IniFile::getDouble(&settingsFile,&local_300,&local_320,0.1);
  this->tpx_dsr_thr = dVar1;
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_340,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_360,"min_sim_time_horizon",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_340,&local_360,0);
  this->min_sim_time_horizon = uVar5;
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string((string *)&local_380,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_3a0,"max_sim_time_horizon",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_380,&local_3a0,0);
  this->max_sim_time_horizon = uVar5;
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::string((string *)&local_3c0,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_3e0,"sim_time_horizon",&local_b7b);
  dVar1 = utils::IniFile::getDouble(&settingsFile,&local_3c0,&local_3e0,0.3);
  this->sim_time_horizon = dVar1;
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::string((string *)&local_400,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_420,"tpx_time_horizon",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_400,&local_420,500000);
  this->tpx_time_horizon = uVar5;
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_440,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_460,"perf_sampling_period",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_440,&local_460,250000);
  this->perf_sampling_period = uVar5;
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string((string *)&local_480,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_4a0,"float_tolerance",&local_b7b);
  dVar1 = utils::IniFile::getDouble(&settingsFile,&local_480,&local_4a0,1e-05);
  this->float_tolerance = dVar1;
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::string((string *)&local_4c0,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_4e0,"time_tolerance",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_4c0,&local_4e0,10000);
  this->time_tolerance = uVar5;
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::string((string *)&local_500,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_520,"primary_thz",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_500,&local_520,3600000);
  this->primary_thz = uVar5;
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::string((string *)&local_540,"System",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_560,"secondary_thz",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_540,&local_560,7200000);
  this->secondary_thz = uVar5;
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::string((string *)&local_580,"Debug",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_5a0,"debug",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_580,&local_5a0,true);
  this->debug = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string((string *)&local_5c0,"Debug",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_5e0,"debug_windows",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_5c0,&local_5e0,1);
  this->debug_windows = uVar5;
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::string((string *)&local_600,"Debug",&local_b7b);
  std::__cxx11::string::string((string *)&local_620,"trace_levels",&local_b79);
  std::__cxx11::string::string((string *)&local_640,"CC",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_600,&local_620,&local_640);
  iVar3 = std::__cxx11::stoi(&local_b78,(size_t *)0x0,0x10);
  this->trace_levels = (long)iVar3;
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::string((string *)&local_660,"Resilience",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_680,"ntf_mk_resilience",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_660,&local_680,1);
  this->ntf_mk_resilience = uVar5;
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::string((string *)&local_6a0,"Resilience",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_6c0,"goal_pred_success_resilience",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_6a0,&local_6c0,1000);
  this->goal_pred_success_resilience = uVar5;
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::string((string *)&local_6e0,"Objects",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_700,"get_objects",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_6e0,&local_700,false);
  this->get_objects = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::string((string *)&local_720,"Objects",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_740,"decompile_objects",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_720,&local_740,false);
  this->decompile_objects = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::string((string *)&local_760,"Objects",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_780,"decompile_to_file",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_760,&local_780,false);
  this->decompile_to_file = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::string((string *)&local_7a0,"Objects",&local_b7b);
  std::__cxx11::string::string((string *)&local_7c0,"decompilation_file_path",&local_b79);
  std::__cxx11::string::string((string *)&local_7e0,"../Test/decompiled.replicode",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_7a0,&local_7c0,&local_7e0);
  std::__cxx11::string::operator=((string *)&this->decompilation_file_path,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::string((string *)&local_800,"Objects",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_820,"ignore_named_objects",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_800,&local_820,false);
  this->ignore_named_objects = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::string((string *)&local_840,"Objects",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_860,"write_objects",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_840,&local_860,false);
  this->write_objects = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::string((string *)&local_880,"Objects",&local_b7b);
  std::__cxx11::string::string((string *)&local_8a0,"objects_path",&local_b79);
  std::__cxx11::string::string((string *)&local_8c0,"objects.image",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_880,&local_8a0,&local_8c0);
  std::__cxx11::string::operator=((string *)&this->objects_path,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::string((string *)&local_8e0,"Objects",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_900,"test_objects",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_8e0,&local_900,false);
  this->test_objects = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::string((string *)&local_920,"Run",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_940,"run_time",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_920,&local_940,0x2760);
  this->run_time = uVar5;
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::string((string *)&local_960,"Run",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_980,"probe_level",&local_b7b);
  uVar5 = utils::IniFile::getInt(&settingsFile,&local_960,&local_980,2);
  this->probe_level = uVar5;
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::string((string *)&local_9a0,"Models",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_9c0,"get_models",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_9a0,&local_9c0,false);
  this->get_models = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::string((string *)&local_9e0,"Models",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_a00,"decompile_models",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_9e0,&local_a00,false);
  this->decompile_models = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::string((string *)&local_a20,"Models",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_a40,"ignore_named_models",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_a20,&local_a40,false);
  this->ignore_named_models = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::string((string *)&local_a60,"Models",&local_b7b);
  std::__cxx11::string::string((string *)&local_a80,"models_path",&local_b79);
  std::__cxx11::string::string((string *)&local_aa0,"models.image",&local_b7a);
  utils::IniFile::getString(&local_b78,&settingsFile,&local_a60,&local_a80,&local_aa0);
  std::__cxx11::string::operator=((string *)&this->models_path,(string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::string((string *)&local_ac0,"Models",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_ae0,"write_models",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_ac0,&local_ae0,false);
  this->write_models = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::string((string *)&local_b00,"Models",(allocator *)&local_b78);
  std::__cxx11::string::string((string *)&local_b20,"test_models",&local_b7b);
  iVar3 = utils::IniFile::getBool(&settingsFile,&local_b00,&local_b20,false);
  this->test_models = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_b20);
  std::__cxx11::string::~string((string *)&local_b00);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&settingsFile);
  return true;
}

Assistant:

bool load(const char *file_name)
    {
        utils::IniFile settingsFile;

        if (!settingsFile.readFile(file_name)) {
            std::cerr << "Unable to load settings, using defaults";
        }

        ::debug("settings") << "Loading settings file" << file_name;
        usr_operator_path = settingsFile.getString("Load", "usr_operator_path", "../build/usr_operators/libusr_operators.so");
        usr_class_path = settingsFile.getString("Load", "usr_class_path", "./V1.2/user.classes.replicode");
        source_file_name = settingsFile.getString("Load", "source_file_name",  "./V1.2/test.2.replicode");
        unsigned int cores = std::thread::hardware_concurrency();
        ::debug("settings") << "number of CPU cores available:" << cores;
        base_period = settingsFile.getInt("Init", "base_period", 50000);
        reduction_core_count = settingsFile.getInt("Init", "reduction_core_count", (cores * 3) / 4 + 1);
        time_core_count = settingsFile.getInt("Init", "time_core_count", (cores - ((cores * 3) / 4)) + 1);
        mdl_inertia_sr_thr = settingsFile.getDouble("System", "mdl_inertia_sr_thr", 0.9);
        mdl_inertia_cnt_thr = settingsFile.getInt("System", "mdl_inertia_cnt_thr", 6);
        tpx_dsr_thr = settingsFile.getDouble("System", "tpx_dsr_thr", 0.1);
        min_sim_time_horizon = settingsFile.getInt("System", "min_sim_time_horizon", 0);
        max_sim_time_horizon = settingsFile.getInt("System", "max_sim_time_horizon", 0);
        sim_time_horizon = settingsFile.getDouble("System", "sim_time_horizon", 0.3);
        tpx_time_horizon = settingsFile.getInt("System", "tpx_time_horizon", 500000);
        perf_sampling_period = settingsFile.getInt("System", "perf_sampling_period", 250000);
        float_tolerance = settingsFile.getDouble("System", "float_tolerance", 0.00001);
        time_tolerance = settingsFile.getInt("System", "time_tolerance", 10000);
        primary_thz = settingsFile.getInt("System", "primary_thz", 3600000);
        secondary_thz = settingsFile.getInt("System", "secondary_thz", 7200000);
        this->debug = settingsFile.getBool("Debug", "debug", true);
        debug_windows = settingsFile.getInt("Debug", "debug_windows", 1);
        trace_levels = std::stoi(settingsFile.getString("Debug", "trace_levels", "CC"), nullptr, 16);
        ntf_mk_resilience = settingsFile.getInt("Resilience",  "ntf_mk_resilience", 1);
        goal_pred_success_resilience = settingsFile.getInt("Resilience", "goal_pred_success_resilience", 1000);
        get_objects = settingsFile.getBool("Objects", "get_objects", false);
        decompile_objects = settingsFile.getBool("Objects", "decompile_objects", false);
        decompile_to_file = settingsFile.getBool("Objects", "decompile_to_file", false);
        decompilation_file_path = settingsFile.getString("Objects", "decompilation_file_path", "../Test/decompiled.replicode");
        ignore_named_objects = settingsFile.getBool("Objects", "ignore_named_objects", false);
        write_objects = settingsFile.getBool("Objects", "write_objects", false);
        objects_path = settingsFile.getString("Objects", "objects_path", "objects.image");
        test_objects = settingsFile.getBool("Objects", "test_objects", false);
        run_time = settingsFile.getInt("Run", "run_time", 10080);
        probe_level = settingsFile.getInt("Run", "probe_level", 2);
        get_models = settingsFile.getBool("Models", "get_models", false);
        decompile_models = settingsFile.getBool("Models", "decompile_models", false);
        ignore_named_models = settingsFile.getBool("Models", "ignore_named_models", false);
        models_path = settingsFile.getString("Models", "models_path", "models.image");
        write_models = settingsFile.getBool("Models", "write_models", false);
        test_models = settingsFile.getBool("Models", "test_models", false);
        return true;
    }